

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::Array<kj::Url::QueryParam>::dispose(Array<kj::Url::QueryParam> *this)

{
  QueryParam *pQVar1;
  size_t sVar2;
  
  pQVar1 = this->ptr;
  if (pQVar1 != (QueryParam *)0x0) {
    sVar2 = this->size_;
    this->ptr = (QueryParam *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pQVar1,0x30,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::Url::QueryParam>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }